

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
DoSetSuperProperty_NoFastPath<Js::OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  uint uVar1;
  uint cacheId;
  FunctionBody *this_00;
  InlineCache *inlineCache;
  Var value;
  Var value_00;
  code *pcVar2;
  bool bVar3;
  PropertyId propertyId;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  undefined4 *puVar4;
  ConstructorCache *pCVar5;
  
  if (instance != (Var)0x0) {
    bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    if (bVar3) {
      this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(instance);
    }
    else {
      this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
    }
  }
  uVar1 = playout->PropertyIdIndex;
  if (*(long *)(this + 0x90) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x378,"(this->inlineCaches != nullptr)",
                                "this->inlineCaches != nullptr");
    if (!bVar3) goto LAB_00a8debb;
    *puVar4 = 0;
  }
  if (*(uint *)(this + 200) <= uVar1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/InterpreterStackFrame.h"
                                ,0x379,"(cacheIndex < this->inlineCacheCount)",
                                "cacheIndex < this->inlineCacheCount");
    if (!bVar3) {
LAB_00a8debb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  inlineCache = *(InlineCache **)(*(long *)(this + 0x90) + (ulong)uVar1 * 8);
  cacheId = playout->PropertyIdIndex;
  propertyId = FunctionBody::GetPropertyIdFromCacheId(this_00,cacheId);
  value = *(Var *)(this + (ulong)playout->Value * 8 + 0x160);
  ValidateRegValue(this,value,false,true);
  value_00 = *(Var *)(this + (ulong)playout->Value2 * 8 + 0x160);
  ValidateRegValue(this,value_00,false,true);
  JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false,Js::InlineCache>
            (this_00,inlineCache,cacheId,instance,propertyId,value,value_00,flags);
  bVar3 = VarIs<Js::RecyclableObject>(instance);
  if (bVar3) {
    pCVar5 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
    if ((pCVar5->content).updateAfterCtor == true) {
      InlineCache::RemoveFromInvalidationListAndClear
                (inlineCache,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
    }
  }
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::DoSetSuperProperty_NoFastPath(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        InlineCache *const inlineCache = GetInlineCache(playout->PropertyIdIndex);

        JavascriptOperators::PatchPutValueWithThisPtrNoLocalFastPath<false, InlineCache>(
            GetFunctionBody(),
            inlineCache,
            playout->PropertyIdIndex,
            instance,
            GetPropertyIdFromCacheId(playout->PropertyIdIndex),
            GetReg(playout->Value),
            GetReg(playout->Value2),
            flags);

        if (!TaggedNumber::Is(instance) && GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
        {
            // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
            // function object's constructor cache will be updated with the type produced by the constructor. From that
            // point on, when the same function object is used as a constructor, the a new object with the final type will
            // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
            // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
            inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
        }
    }